

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

int fiobj_ary_remove2(FIOBJ ary,FIOBJ data)

{
  int iVar1;
  size_t sVar2;
  intptr_t index;
  int iVar3;
  FIOBJ data_local;
  
  data_local = data;
  if (ary != 0) {
    sVar2 = fiobj_type_is(ary,(fiobj_type_enum)data);
    if (sVar2 != 0) {
      index = fio_ary___find((fio_ary___s *)(ary + 8),data);
      iVar3 = -1;
      if (index != -1) {
        iVar1 = fio_ary___remove((fio_ary___s *)(ary + 8),index,&data_local);
        if (iVar1 != -1) {
          fiobj_free(data_local);
          iVar3 = 0;
        }
      }
      return iVar3;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xe6,"int fiobj_ary_remove2(FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_ary_remove2(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  if (-1 == fio_ary___remove2(&obj2ary(ary)->ary, data, &data)) {
    return -1;
  }
  fiobj_free(data);
  return 0;
}